

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestInvoker *_testCase,string *_className,
                   NameAndTags *nameAndTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  pointer pbVar4;
  SpecialProperties SVar5;
  int iVar6;
  size_type sVar7;
  bool bVar8;
  string *tag_00;
  bool bVar9;
  long lVar10;
  string tag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  TestCaseInfo info;
  string local_180;
  SourceLineInfo *local_160;
  TestCase *local_158;
  NameAndTags *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  ITestInvoker *local_128;
  string *local_120;
  string local_118;
  string local_f8;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8 [2];
  char local_a8 [16];
  _Alloc_hider local_98 [2];
  char local_88 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [2];
  
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  sVar2 = (nameAndTags->tags).m_size;
  local_128 = _testCase;
  local_120 = _className;
  if (sVar2 != 0) {
    pcVar3 = (nameAndTags->tags).m_start;
    sVar7 = 0;
    bVar9 = false;
    bVar8 = false;
    local_160 = _lineInfo;
    local_158 = __return_storage_ptr__;
    local_150 = nameAndTags;
    do {
      cVar1 = pcVar3[sVar7];
      if (bVar8) {
        tag_00 = &local_180;
        if (cVar1 == ']') {
          SVar5 = anon_unknown_1::parseSpecialTag(tag_00);
          bVar8 = true;
          if (((((SVar5 & IsHidden) == None) && (bVar8 = bVar9, SVar5 == None)) &&
              (SVar5 = anon_unknown_1::parseSpecialTag(&local_180), SVar5 == None)) &&
             ((local_180._M_string_length != 0 &&
              (iVar6 = isalnum((uint)(byte)*local_180._M_dataplus._M_p), iVar6 == 0)))) {
            ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_118);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_118.field_2._M_allocated_capacity,"Tag name: [",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_118.field_2._M_allocated_capacity,local_180._M_dataplus._M_p
                       ,local_180._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_118.field_2._M_allocated_capacity,"] is not allowed.\n",0x12
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_118.field_2._M_allocated_capacity,
                       "Tag names starting with non alphanumeric characters are reserved\n",0x41);
            operator<<((ostream *)local_118.field_2._M_allocated_capacity,local_160);
            std::__cxx11::stringbuf::str();
            throw_domain_error((string *)local_d8);
          }
          bVar9 = bVar8;
          if (((local_180._M_string_length != 0) && (local_180._M_string_length != 1)) &&
             (*local_180._M_dataplus._M_p == 0x2e)) {
            std::__cxx11::string::erase((ulong)&local_180,0);
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,(value_type *)&local_180);
          local_180._M_string_length = 0;
          *local_180._M_dataplus._M_p = 0;
          bVar8 = false;
          nameAndTags = local_150;
        }
        else {
LAB_00168153:
          std::__cxx11::string::push_back((char)tag_00);
        }
      }
      else {
        tag_00 = &local_f8;
        if (cVar1 != '[') goto LAB_00168153;
        bVar8 = true;
      }
      pbVar4 = local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    __return_storage_ptr__ = local_158;
    _lineInfo = local_160;
    if (bVar9) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,".","");
      local_b8[0]._M_p = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"!hide","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 pbVar4,local_d8,local_98);
      _lineInfo = local_160;
      lVar10 = 0;
      do {
        pcVar3 = *(char **)((long)&local_b8[0]._M_p + lVar10);
        if (local_a8 + lVar10 != pcVar3) {
          operator_delete(pcVar3);
        }
        lVar10 = lVar10 + -0x20;
        __return_storage_ptr__ = local_158;
        nameAndTags = local_150;
      } while (lVar10 != -0x40);
    }
  }
  pcVar3 = (nameAndTags->name).m_start;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,pcVar3,pcVar3 + (nameAndTags->name).m_size);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_d8,&local_118,local_120,&local_f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_148,_lineInfo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  TestCase::TestCase(__return_storage_ptr__,local_128,(TestCaseInfo *)local_d8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_60);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_98[0]._M_p != local_88) {
    operator_delete(local_98[0]._M_p);
  }
  if (local_b8[0]._M_p != local_a8) {
    operator_delete(local_b8[0]._M_p);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestInvoker* _testCase,
                            std::string const& _className,
                            NameAndTags const& nameAndTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden = false;

        // Parse out tags
        std::vector<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for (char c : nameAndTags.tags) {
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( ( prop & TestCaseInfo::IsHidden ) != 0 )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    // Merged hide tags like `[.approvals]` should be added as
                    // `[.][approvals]`. The `[.]` is added at later point, so
                    // we only strip the prefix
                    if (startsWith(tag, '.') && tag.size() > 1) {
                        tag.erase(0, 1);
                    }
                    tags.push_back( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            // Add all "hidden" tags to make them behave identically
            tags.insert( tags.end(), { ".", "!hide" } );
        }

        TestCaseInfo info( static_cast<std::string>(nameAndTags.name), _className, desc, tags, _lineInfo );
        return TestCase( _testCase, std::move(info) );
    }